

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CheckCollSeq(Parse *pParse,CollSeq *pColl)

{
  CollSeq *pCVar1;
  CollSeq *p;
  sqlite3 *db;
  char *zName;
  CollSeq *pColl_local;
  Parse *pParse_local;
  
  if (((pColl == (CollSeq *)0x0) ||
      (pColl->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) ||
     (pCVar1 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName),
     pCVar1 != (CollSeq *)0x0)) {
    pParse_local._4_4_ = 0;
  }
  else {
    pParse_local._4_4_ = 1;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3CheckCollSeq(Parse *pParse, CollSeq *pColl){
  if( pColl && pColl->xCmp==0 ){
    const char *zName = pColl->zName;
    sqlite3 *db = pParse->db;
    CollSeq *p = sqlite3GetCollSeq(pParse, ENC(db), pColl, zName);
    if( !p ){
      return SQLITE_ERROR;
    }
    assert( p==pColl );
  }
  return SQLITE_OK;
}